

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readInterpolationSequenceRecord.hpp
# Opt level: O3

InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients> * __thiscall
njoy::ENDFtk::
readInterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>
           *__return_storage_ptr__,ENDFtk *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  int in_stack_ffffffffffffff58;
  InterpolationRecord interpolation;
  
  InterpolationRecord::
  InterpolationRecord<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&interpolation,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
  readSequence<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
              *)&stack0xffffffffffffff58,this,begin,end,(long *)((ulong)lineNumber & 0xffffffff),MAT
             ,MF,(int)interpolation.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1],in_stack_ffffffffffffff58);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>::
  InterpolationSequenceRecord
            (__return_storage_ptr__,&interpolation,
             (vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
              *)&stack0xffffffffffffff58);
  std::
  vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
  ::~vector((vector<njoy::ENDFtk::section::Type<14>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<14>::LegendreCoefficients>_>
             *)&stack0xffffffffffffff58);
  if (interpolation.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(interpolation.super_InterpolationBase.interpolationSchemeIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)interpolation.super_InterpolationBase.interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)interpolation.super_InterpolationBase.interpolationSchemeIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (interpolation.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(interpolation.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)interpolation.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)interpolation.super_InterpolationBase.boundaryIndices.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

InterpolationSequenceRecord< Component >
readInterpolationSequenceRecord( Iterator& begin,
                                 const Iterator& end,
                                 long& lineNumber,
                                 int MAT,
                                 int MF,
                                 int MT ) {

  InterpolationRecord interpolation( begin, end, lineNumber, MAT, MF, MT );
  return InterpolationSequenceRecord(
             std::move( interpolation ),
             readSequence< Component >( begin, end, lineNumber, MAT, MF, MT,
                                        interpolation.NZ() ) );
}